

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pscp.c
# Opt level: O0

int scp_send_filename(char *name,uint64_t size,int permissions)

{
  Backend *pBVar1;
  FILE *stream;
  sftp_packet *pktin_00;
  char *pcVar2;
  size_t sVar3;
  char *buf;
  fxp_attrs attrs;
  sftp_request *req;
  sftp_packet *pktin;
  char *fullname;
  int permissions_local;
  uint64_t size_local;
  char *name_local;
  
  if (using_sftp) {
    if (scp_sftp_targetisdir) {
      pktin = (sftp_packet *)dupcat_fn(scp_sftp_remotepath,"/",name,0);
    }
    else {
      pktin = (sftp_packet *)dupstr(scp_sftp_remotepath);
    }
    if (permissions < 0) {
      buf = (char *)0x0;
    }
    else {
      buf = (char *)0x4;
      attrs.gid = (unsigned_long)permissions;
    }
    attrs.mtime = (unsigned_long)fxp_open_send((char *)pktin,0x1a,(fxp_attrs *)&buf);
    pktin_00 = sftp_wait_for_reply((sftp_request *)attrs.mtime);
    scp_sftp_filehandle = fxp_open_recv(pktin_00,(sftp_request *)attrs.mtime);
    stream = _stderr;
    if (scp_sftp_filehandle == (fxp_handle *)0x0) {
      pcVar2 = fxp_error();
      tell_user(stream,"pscp: unable to open %s: %s",pktin,pcVar2);
      safefree(pktin);
      errs = errs + 1;
      name_local._4_4_ = 1;
    }
    else {
      scp_sftp_fileoffset = 0;
      scp_sftp_xfer = xfer_upload_init(scp_sftp_filehandle,0);
      safefree(pktin);
      name_local._4_4_ = 0;
    }
  }
  else {
    fullname._4_4_ = permissions;
    if (permissions < 0) {
      fullname._4_4_ = 0x1a4;
    }
    pcVar2 = dupprintf("C%04o %lu ",(ulong)(fullname._4_4_ & 0xfff),size);
    pBVar1 = backend;
    sVar3 = strlen(pcVar2);
    backend_send(pBVar1,pcVar2,sVar3);
    safefree(pcVar2);
    pBVar1 = backend;
    sVar3 = strlen(name);
    backend_send(pBVar1,name,sVar3);
    backend_send(backend,"\n",1);
    name_local._4_4_ = response();
  }
  return name_local._4_4_;
}

Assistant:

int scp_send_filename(const char *name, uint64_t size, int permissions)
{
    if (using_sftp) {
        char *fullname;
        struct sftp_packet *pktin;
        struct sftp_request *req;
        struct fxp_attrs attrs;

        if (scp_sftp_targetisdir) {
            fullname = dupcat(scp_sftp_remotepath, "/", name);
        } else {
            fullname = dupstr(scp_sftp_remotepath);
        }

        attrs.flags = 0;
        PUT_PERMISSIONS(attrs, permissions);

        req = fxp_open_send(fullname,
                            SSH_FXF_WRITE | SSH_FXF_CREAT | SSH_FXF_TRUNC,
                            &attrs);
        pktin = sftp_wait_for_reply(req);
        scp_sftp_filehandle = fxp_open_recv(pktin, req);

        if (!scp_sftp_filehandle) {
            tell_user(stderr, "pscp: unable to open %s: %s",
                      fullname, fxp_error());
            sfree(fullname);
            errs++;
            return 1;
        }
        scp_sftp_fileoffset = 0;
        scp_sftp_xfer = xfer_upload_init(scp_sftp_filehandle,
                                         scp_sftp_fileoffset);
        sfree(fullname);
        return 0;
    } else {
        char *buf;
        if (permissions < 0)
            permissions = 0644;
        buf = dupprintf("C%04o %"PRIu64" ", (int)(permissions & 07777), size);
        backend_send(backend, buf, strlen(buf));
        sfree(buf);
        backend_send(backend, name, strlen(name));
        backend_send(backend, "\n", 1);
        return response();
    }
}